

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int soplex::deQueueMin(int *heap,int *size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar1 = *heap;
  iVar2 = *size;
  *size = iVar2 + -1;
  iVar3 = heap[(long)iVar2 + -1];
  iVar5 = 1;
  iVar7 = 0;
  while( true ) {
    if (iVar2 + -2 <= iVar5) break;
    iVar4 = heap[iVar5];
    iVar8 = heap[(long)iVar5 + 1];
    if (iVar4 < iVar8) {
      iVar6 = iVar5;
      iVar8 = iVar4;
      if (iVar3 <= iVar4) goto LAB_0017c09f;
    }
    else {
      if (iVar3 <= iVar8) goto LAB_0017c09f;
      iVar6 = iVar5 + 1;
    }
    heap[iVar7] = iVar8;
    iVar5 = iVar6 * 2 + 1;
    iVar7 = iVar6;
  }
  if ((iVar5 < *size) && (heap[iVar5] < iVar3)) {
    heap[iVar7] = heap[iVar5];
    iVar7 = iVar5;
  }
LAB_0017c09f:
  heap[iVar7] = iVar3;
  return iVar1;
}

Assistant:

static inline int deQueueMin(int* heap, int* size)
{
   int e, elem;
   int i, j, s;
   int e1, e2;

   elem = *heap;
   e = heap[s = --(*size)];
   --s;

   for(j = 0, i = 1; i < s; i = 2 * j + 1)
   {
      e1 = heap[i];
      e2 = heap[i + 1];

      if(e1 < e2)
      {
         if(e > e1)
         {
            heap[j] = e1;
            j = i;
         }
         else
         {
            heap[j] = e;
            return elem;
         }
      }
      else
      {
         if(e > e2)
         {
            heap[j] = e2;
            j = i + 1;
         }
         else
         {
            heap[j] = e;
            return elem;
         }
      }
   }

   if(i < *size && e > heap[i])
   {
      heap[j] = heap[i];
      j = i;
   }

   heap[j] = e;

   return elem;
}